

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::Importer::Importer
          (Importer *this,SourceTree *source_tree,MultiFileErrorCollector *error_collector)

{
  ErrorCollector *error_collector_00;
  MultiFileErrorCollector *error_collector_local;
  SourceTree *source_tree_local;
  Importer *this_local;
  
  SourceTreeDescriptorDatabase::SourceTreeDescriptorDatabase(&this->database_,source_tree);
  error_collector_00 = SourceTreeDescriptorDatabase::GetValidationErrorCollector(&this->database_);
  DescriptorPool::DescriptorPool(&this->pool_,(DescriptorDatabase *)this,error_collector_00);
  DescriptorPool::EnforceWeakDependencies(&this->pool_,true);
  SourceTreeDescriptorDatabase::RecordErrorsTo(&this->database_,error_collector);
  return;
}

Assistant:

Importer::Importer(SourceTree* source_tree,
                   MultiFileErrorCollector* error_collector)
  : database_(source_tree),
    pool_(&database_, database_.GetValidationErrorCollector()) {
  pool_.EnforceWeakDependencies(true);
  database_.RecordErrorsTo(error_collector);
}